

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:290:66)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:290:66)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  value *v;
  pointer v_00;
  wstring_view wVar2;
  wstring_view p;
  gc_heap_ptr_untyped local_40;
  object_ptr o;
  
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&o,v);
  v_00 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if ((int)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)v_00) / 0x28) < 1) {
    v_00 = (pointer)&value::undefined;
  }
  to_string((mjs *)&local_40,o.super_gc_heap_ptr_untyped.heap_,v_00);
  wVar2 = string::view((string *)&local_40);
  p._M_len = wVar2._M_str;
  p._M_str = (wchar_t *)v_00;
  bVar1 = anon_unknown_33::has_own_property((anon_unknown_33 *)&o,(object_ptr *)wVar2._M_len,p);
  __return_storage_ptr__->type_ = boolean;
  (__return_storage_ptr__->field_1).b_ = bVar1;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }